

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_portal.cpp
# Opt level: O3

void __thiscall GLPortal::SaveMapSection(GLPortal *this)

{
  uint *puVar1;
  uint uVar2;
  uint uVar3;
  
  uVar2 = currentmapsection.Count;
  puVar1 = &(this->savedmapsection).Count;
  uVar3 = currentmapsection.Count - *puVar1;
  if (*puVar1 <= currentmapsection.Count && uVar3 != 0) {
    TArray<unsigned_char,_unsigned_char>::Grow(&this->savedmapsection,uVar3);
  }
  uVar3 = currentmapsection.Count;
  (this->savedmapsection).Count = uVar2;
  memcpy((this->savedmapsection).Array,currentmapsection.Array,(ulong)uVar3);
  memset(currentmapsection.Array,0,(ulong)currentmapsection.Count);
  return;
}

Assistant:

void GLPortal::SaveMapSection()
{
	savedmapsection.Resize(currentmapsection.Size());
	memcpy(&savedmapsection[0], &currentmapsection[0], currentmapsection.Size());
	memset(&currentmapsection[0], 0, currentmapsection.Size());
}